

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O0

int AF_A_HandLower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  DPSprite *this_01;
  FState *pFVar1;
  bool bVar2;
  bool local_5e;
  bool local_5b;
  DPSprite *psp;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                  ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (DObject *)(param->field_0).field_1.a;
    local_5b = true;
    if (this != (DObject *)0x0) {
      local_5b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                        ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this_00 = (DObject *)param[1].field_0.field_1.a;
        local_5e = true;
        if (this_00 != (DObject *)0x0) {
          local_5e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        }
        if (local_5e == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                        ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                        ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if (*(long *)&this[0xc].ObjectFlags != 0) {
        this_01 = player_t::GetPSprite(*(player_t **)&this[0xc].ObjectFlags,PSP_STRIFEHANDS);
        pFVar1 = DPSprite::GetState(this_01);
        if (pFVar1 == (FState *)0x0) {
          DPSprite::SetState(this_01,(FState *)0x0,false);
        }
        else {
          this_01->y = this_01->y + 9.0;
          if (256.0 < this_01->y) {
            DPSprite::SetState(this_01,(FState *)0x0,false);
          }
          if (0 < *(int *)(*(long *)&this[0xc].ObjectFlags + 0x138)) {
            *(int *)(*(long *)&this[0xc].ObjectFlags + 0x138) =
                 *(int *)(*(long *)&this[0xc].ObjectFlags + 0x138) + -1;
          }
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                  ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_HandLower)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != nullptr)
	{
		DPSprite *psp = self->player->GetPSprite(PSP_STRIFEHANDS);

		if (psp->GetState() == nullptr)
		{
			psp->SetState(nullptr);
			return 0;
		}

		psp->y += 9;
		if (psp->y > WEAPONBOTTOM*2)
		{
			psp->SetState(nullptr);
		}

		if (self->player->extralight > 0) self->player->extralight--;
	}
	return 0;
}